

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O3

float __thiscall
sptk::reaper::FFT::get_band_rms(FFT *this,float *x,float *y,int first_bin,int last_bin)

{
  int i;
  long lVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (first_bin <= last_bin) {
    lVar1 = 0;
    do {
      dVar2 = dVar2 + (double)(x[first_bin + lVar1] * x[first_bin + lVar1] +
                              y[first_bin + lVar1] * y[first_bin + lVar1]);
      lVar1 = lVar1 + 1;
    } while ((last_bin - first_bin) + 1 != (int)lVar1);
  }
  dVar2 = dVar2 / (double)((last_bin - first_bin) + 1);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return (float)dVar2;
}

Assistant:

float FFT::get_band_rms(float *x, float*y, int first_bin, int last_bin) {
  double sum = 0.0;
  for (int i = first_bin; i <= last_bin; ++i) {
    sum += (x[i] * x[i]) + (y[i] * y[i]);
  }
  return sqrt(sum / (last_bin - first_bin + 1));
}